

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O0

void * authenticateMAC(void *parameters)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  ulong __size;
  uint64_t *header_00;
  uint8_t *hash;
  chunk *pcVar4;
  bool bVar5;
  bool bVar6;
  ulong local_68;
  size_t i;
  uint64_t *stored_mac;
  chunk *stored_mac_chunk;
  uint64_t *calculated_mac;
  uint64_t *test_header;
  uint64_t block_byte_size;
  uint64_t mac_progress;
  macParams *params;
  chunk *mac_chunk;
  _Bool maced;
  _Bool header;
  void *parameters_local;
  
  bVar6 = true;
  bVar1 = false;
  params = (macParams *)0x0;
  block_byte_size = 0;
  while( true ) {
    bVar5 = false;
    if ((**(byte **)((long)parameters + 8) & 1) != 0) {
      bVar5 = **(int **)((long)parameters + 0x18) == 0;
    }
    if (!bVar5) break;
    if (params == (macParams *)0x0) {
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
      pcVar4 = front(*(queue **)((long)parameters + 0x38));
      if (((pcVar4 != (chunk *)0x0) &&
          (params = (macParams *)front(*(queue **)((long)parameters + 0x38)),
          params != (macParams *)0x0)) && (*(uint8_t *)&params->mac_status != '\x06')) {
        deque(*(queue **)((long)parameters + 0x38));
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
    }
    if ((params != (macParams *)0x0) &&
       ((*(char *)&params->mac_status == '\x06' || (*(char *)&params->mac_status == '\x05'))))
    break;
    if ((params != (macParams *)0x0) && (bVar6)) {
      __size = **(ulong **)((long)parameters + 0x50) >> 3;
      header_00 = (uint64_t *)calloc(2,__size);
      if (header_00 == (uint64_t *)0x0) {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffff4;
        return (void *)0x0;
      }
      memcpy(header_00,params->running,__size << 1);
      decryptHeader(*(ThreefishKey_t **)((long)parameters + 0x50),header_00);
      _Var2 = checkHeader(header_00,*(uint64_t **)((long)parameters + 0x58),
                          (SkeinSize_t)**(undefined8 **)((long)parameters + 0x50));
      if (!_Var2) {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffffb;
        destroyChunk((chunk *)params);
        if (header_00 == (uint64_t *)0x0) {
          return (void *)0x0;
        }
        free(header_00);
        return (void *)0x0;
      }
      bVar6 = false;
      block_byte_size = __size * 2 + block_byte_size;
      **(undefined1 **)((long)parameters + 0x10) = 1;
      if (header_00 != (uint64_t *)0x0) {
        free(header_00);
      }
    }
    if ((params != (macParams *)0x0) && (!bVar1)) {
      *(undefined1 *)&params->mac_status =
           *(undefined1 *)(*(long *)((long)parameters + 0x20) + 0x1b0);
      skeinUpdate(*(SkeinCtx_t **)(*(long *)((long)parameters + 0x20) + 0x1a8),params->running,
                  (size_t)params->valid);
      block_byte_size = (uint64_t)(params->valid + block_byte_size);
      bVar1 = true;
    }
    if (((params != (macParams *)0x0) && (bVar1)) &&
       (_Var2 = queueIsFull(*(queue **)((long)parameters + 0x40)), !_Var2)) {
      while (_Var2 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var2) {
        nanosleep((timespec *)&wait_interval,(timespec *)0x0);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
      _Var2 = enque((chunk *)params,*(queue **)((long)parameters + 0x40));
      if (_Var2) {
        bVar1 = false;
        params = (macParams *)0x0;
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
    }
    if ((block_byte_size != 0) &&
       (iVar3 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
       , iVar3 == 0)) {
      *(uint64_t *)(*(long *)((long)parameters + 0x48) + 0x18) =
           block_byte_size + *(long *)(*(long *)((long)parameters + 0x48) + 0x18);
      block_byte_size = 0;
      pthread_mutex_unlock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8));
    }
  }
  hash = (uint8_t *)calloc(*(size_t *)(*(long *)((long)parameters + 0x20) + 0x1c0),1);
  if (hash == (uint8_t *)0x0) {
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffff4;
  }
  else {
    skeinFinal(*(SkeinCtx_t **)(*(long *)((long)parameters + 0x20) + 0x1a8),hash);
    stored_mac = (uint64_t *)0x0;
    do {
      bVar6 = false;
      if ((**(byte **)((long)parameters + 8) & 1) != 0) {
        bVar6 = **(int **)((long)parameters + 0x18) == 0;
      }
      if (!bVar6) break;
      if ((stored_mac == (uint64_t *)0x0) &&
         (pcVar4 = front(*(queue **)((long)parameters + 0x38)), pcVar4 != (chunk *)0x0)) {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
        stored_mac = (uint64_t *)front(*(queue **)((long)parameters + 0x38));
        if ((chunk *)stored_mac != (chunk *)0x0) {
          deque(*(queue **)((long)parameters + 0x38));
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
      }
    } while (stored_mac == (uint64_t *)0x0);
    if ((stored_mac == (uint64_t *)0x0) || ((char)*stored_mac != '\x06')) {
      **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
      if (hash != (uint8_t *)0x0) {
        free(hash);
      }
    }
    else {
      for (local_68 = 0; local_68 < *(ulong *)(*(long *)((long)parameters + 0x20) + 0x1c0) >> 3;
          local_68 = local_68 + 1) {
        if (*(long *)(hash + local_68 * 8) != *(long *)(stored_mac[1] + local_68 * 8)) {
          **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
          free(hash);
          destroyChunk((chunk *)stored_mac);
          return (void *)0x0;
        }
      }
      while (_Var2 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var2) {
        nanosleep((timespec *)&wait_interval,(timespec *)0x0);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
      _Var2 = queueDone(*(queue **)((long)parameters + 0x40));
      if (_Var2) {
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
        if (stored_mac != (uint64_t *)0x0) {
          destroyChunk((chunk *)stored_mac);
        }
        if (hash != (uint8_t *)0x0) {
          free(hash);
        }
      }
      else {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffff1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* authenticateMAC(void* parameters)
{
    pdebug("authenticateMAC()\n");
    bool header = true;
    bool maced = false;
    chunk* mac_chunk = NULL;    
    macParams* params = parameters;
    uint64_t mac_progress = 0;
 
    while (*(params->running) && *(params->error) == 0)
    {
        //get the next chunk
        if (mac_chunk == NULL)
        {
            pthread_mutex_lock(params->in_mutex);
            if (front(params->in) != NULL)
            {
                pdebug("*** attempting to deque chunk to mac ***\n");
                mac_chunk = front(params->in);
                if (mac_chunk != NULL && mac_chunk->action != MAC)
                { deque(params->in); } //if the operation succeeded deque the chunk
            }
            pthread_mutex_unlock(params->in_mutex);
        }

        //check for loop termination conditions
        if (mac_chunk != NULL && (mac_chunk->action == MAC ||
            mac_chunk->action == DONE))
        { break; }

        //check the header
        if (mac_chunk != NULL && header)
        {
            pdebug("*** checking header ***\n");
            const uint64_t block_byte_size = (params->tf_key->stateSize)/8;
            uint64_t* test_header = calloc(2, block_byte_size);

            if (test_header == NULL) //Sanity check 
            {
                *(params->error) = MEMORY_ALLOCATION_FAIL;
                return NULL;
            }
            /* test the header in a buffer so we can keep the original header encrypted
             * in memory*/
            memcpy(test_header, mac_chunk->data, 2*block_byte_size);
            decryptHeader(params->tf_key, test_header);

            if (!checkHeader(test_header, params->file_size, params->tf_key->stateSize))
            {
                pdebug("*** Header check failed ***\n");
                pdebug("*** Ran header check on chunk of size %lu ***\n", mac_chunk->data_size);
                *(params->error) = HEADER_CHECK_FAIL; //set the error flag
		        destroyChunk(mac_chunk); //free any resources that are not in the queue
                if (test_header != NULL) { free(test_header); }

                return NULL;
            }

            pdebug("*** Header check succeeded ***\n");
            header = false;
            mac_progress += 2*block_byte_size;
            //signal to other processes that the header is valid
            *(params->valid) = true;
             
            if (test_header != NULL) { free(test_header); }
        }

        if (mac_chunk != NULL && !maced) //mac the chunk
        {
            pdebug("*** Updating mac on chunk of size %lu ***\n", mac_chunk->data_size);
            mac_chunk->action = params->mac_context->out_action; 
            skeinUpdate(params->mac_context->skein_context_ptr,
                        (const uint8_t*)mac_chunk->data,
                        mac_chunk->data_size);

	        mac_progress += mac_chunk->data_size;
            maced = true;
        }

        //attempt to queue the chunk
        if (mac_chunk != NULL && maced && !queueIsFull(params->out))
        {
            pdebug("*** Queuing chunk of size %lu ***\n", mac_chunk->data_size);
	        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); }
            
            pthread_mutex_lock(params->out_mutex);
            if (enque(mac_chunk, params->out))
            {
                maced = false;
                mac_chunk = NULL;
            }
            pthread_mutex_unlock(params->out_mutex);
        }
        
	    if (mac_progress > 0)
        {
	        if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += mac_progress;
		        mac_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }
    } //end while loop

    pdebug("*** authenticateMAC() done with first loop ***\n");
    //allocates storage for the calculated mac
    uint64_t* calculated_mac = calloc(params->mac_context->digest_byte_size,
                                      sizeof(uint8_t));

    if (calculated_mac == NULL) //Sanity check 
    {
        *(params->error) = MEMORY_ALLOCATION_FAIL;

        return NULL;
    }
    
    pdebug("*** Calculating MAC ***\n"); 
    skeinFinal(params->mac_context->skein_context_ptr, (uint8_t*)calculated_mac);
    chunk* stored_mac_chunk = NULL;

    //attempt to get the MAC appended to the end of the file
    while (*(params->running) && *(params->error) == 0)
    {
        //dequeue the mac chunk
        if (stored_mac_chunk == NULL && front(params->in) != NULL)
        {
            pdebug("*** Reading stored MAC ***\n");
            pthread_mutex_lock(params->in_mutex);
            stored_mac_chunk = front(params->in);
            if (stored_mac_chunk != NULL) { deque(params->in); }
            pthread_mutex_unlock(params->in_mutex);
        }

        if (stored_mac_chunk != NULL) { break; } //check for the termination condition
    }

    if (stored_mac_chunk == NULL || stored_mac_chunk->action != MAC)
    {
        pdebug("*** Unable to queue stored mac chunk ***\n");
        *(params->error) = MAC_CHECK_FAIL;
        if (calculated_mac != NULL) { free(calculated_mac); }

        return NULL;
    }

    uint64_t* stored_mac = stored_mac_chunk->data; 

    //compare the calculated and stored mac return an error if they don't match
    for (size_t i=0; i<(params->mac_context->digest_byte_size/8); ++i)
    {
        if (calculated_mac[i] != stored_mac[i])
        {
            pdebug("*** MAC check failed. File has been tampered with or was not encrypted with this program ***\n");
            *(params->error) = MAC_CHECK_FAIL;
            free(calculated_mac);
            destroyChunk(stored_mac_chunk);

            return NULL;
        } //if control falls through the MAC is valid
    }

    pdebug("*** MAC check passed ***\n");
    //queue Done flag
    while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //wait until the queue is free 
    pthread_mutex_lock(params->out_mutex);
    if (!queueDone(params->out))
    {
        pdebug("Error queueing done\n");
        *(params->error) = QUEUE_OPERATION_FAIL;

        return NULL;
    }
    pthread_mutex_unlock(params->out_mutex);
    pdebug("*** Done queued *** \n");

    //free any remaining allocated resources
    if (stored_mac_chunk != NULL) { destroyChunk(stored_mac_chunk); }
    if (calculated_mac != NULL) { free(calculated_mac); }

    return NULL;
}